

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  BinsSelectConditionExprSyntax *pBVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  IntersectClauseSyntax *local_58;
  Token local_50;
  Token local_40;
  Token local_30;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_30,
                      (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x40),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x50) == (SyntaxNode *)0x0) {
    local_58 = (IntersectClauseSyntax *)0x0;
  }
  else {
    local_58 = (IntersectClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x50),(DeepCloneVisitor *)&local_58,
                          (BumpAllocator *)__child_stack);
  }
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinsSelectConditionExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::IntersectClauseSyntax*>
                     ((BumpAllocator *)__child_stack,&local_40,&local_50,(NameSyntax *)args_2,
                      &local_30,&local_58);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinsSelectConditionExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinsSelectConditionExprSyntax>(
        node.binsof.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<NameSyntax>(*node.name, alloc),
        node.closeParen.deepClone(alloc),
        node.intersects ? deepClone(*node.intersects, alloc) : nullptr
    );
}